

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O0

void jinit_c_main_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  my_main_ptr main_ptr;
  long local_28;
  int local_1c;
  
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x70);
  in_RDI[0x37] = (long)puVar1;
  *puVar1 = start_pass_main;
  if ((int)in_RDI[0x20] == 0) {
    if (in_ESI == 0) {
      local_1c = 0;
      local_28 = in_RDI[0xb];
      for (; local_1c < *(int *)((long)in_RDI + 0x4c); local_1c = local_1c + 1) {
        uVar2 = (**(code **)(in_RDI[1] + 0x10))
                          (in_RDI,1,*(int *)(local_28 + 0x1c) << 3,*(int *)(local_28 + 0xc) << 3);
        puVar1[(long)local_1c + 4] = uVar2;
        local_28 = local_28 + 0x60;
      }
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_main_controller(j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main_ptr;
  int ci;
  jpeg_component_info *compptr;

  main_ptr = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_main_controller));
  cinfo->main = (struct jpeg_c_main_controller *)main_ptr;
  main_ptr->pub.start_pass = start_pass_main;

  /* We don't need to create a buffer in raw-data mode. */
  if (cinfo->raw_data_in)
    return;

  /* Create the buffer.  It holds downsampled data, so each component
   * may be of a different size.
   */
  if (need_full_buffer) {
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
  } else {
    /* Allocate a strip buffer for each component */
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      main_ptr->buffer[ci] = (*cinfo->mem->alloc_sarray)
        ((j_common_ptr)cinfo, JPOOL_IMAGE,
         compptr->width_in_blocks * DCTSIZE,
         (JDIMENSION)(compptr->v_samp_factor * DCTSIZE));
    }
  }
}